

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_hse.c
# Opt level: O3

void lrc_set_ext_params(xc_func_type *p,double *ext_params)

{
  double dVar1;
  double dVar2;
  double par;
  
  dVar1 = get_ext_param(p,ext_params,0);
  dVar2 = get_ext_param(p,ext_params,1);
  par = get_ext_param(p,ext_params,2);
  *p->mix_coef = -dVar2;
  xc_func_set_ext_params_name(*p->func_aux,"_omega",par);
  p->cam_alpha = dVar1;
  p->cam_beta = dVar2;
  p->cam_omega = par;
  return;
}

Assistant:

static void
lrc_set_ext_params(xc_func_type *p, const double *ext_params)
{
  double alpha, beta, omega;

  assert(p != NULL);

  alpha = get_ext_param(p, ext_params, 0);
  beta  = get_ext_param(p, ext_params, 1);
  omega = get_ext_param(p, ext_params, 2);

  /* DFT part */
  p->mix_coef[0] = -beta;
  xc_func_set_ext_params_name(p->func_aux[0], "_omega", omega);

  /* Set the hybrid flags */
  p->cam_alpha = alpha;
  p->cam_beta  = beta;
  p->cam_omega = omega;
}